

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::GLMClassifier_DoubleArray::GLMClassifier_DoubleArray
          (GLMClassifier_DoubleArray *this,GLMClassifier_DoubleArray *from)

{
  int new_size;
  void *pvVar1;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__GLMClassifier_DoubleArray_00426e60;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->value_).current_size_ = 0;
  (this->value_).total_size_ = 0;
  (this->value_).rep_ = (Rep *)0x0;
  new_size = (from->value_).current_size_;
  if (new_size != 0) {
    google::protobuf::RepeatedField<double>::Reserve(&this->value_,new_size);
    memcpy(((this->value_).rep_)->elements,((from->value_).rep_)->elements,
           (long)(from->value_).current_size_ << 3);
    (this->value_).current_size_ = (from->value_).current_size_;
  }
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  return;
}

Assistant:

GLMClassifier_DoubleArray::GLMClassifier_DoubleArray(const GLMClassifier_DoubleArray& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      value_(from.value_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.GLMClassifier.DoubleArray)
}